

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

HashBlock * sha256(HashBlock *__return_storage_ptr__,string *message)

{
  vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_> *__x;
  pointer pbVar1;
  HashBlock *pHVar2;
  ostream *poVar3;
  pointer pbVar4;
  vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_> w;
  vector<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
  ws;
  vector<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_> blocks;
  vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_> local_b0;
  HashBlock *local_98;
  vector<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_> local_90;
  vector<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
  local_78;
  vector<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_> local_60;
  vector<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
  local_48;
  
  pad_parse(&local_60,(message->_M_dataplus)._M_p,(int)message->_M_string_length);
  std::vector<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_>::vector(&local_90,&local_60)
  ;
  expand(&local_78,&local_90);
  local_98 = __return_storage_ptr__;
  __x = local_78.
        super__Vector_base<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  if (local_90.super__Vector_base<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.
                    super__Vector_base<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.
                          super__Vector_base<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.
                          super__Vector_base<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    __x = local_78.
          super__Vector_base<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  }
  for (; __x != local_78.
                super__Vector_base<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
    std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>::vector(&local_b0,__x);
    pbVar1 = local_b0.super__Vector_base<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pbVar4 = local_b0.
                  super__Vector_base<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>._M_impl
                  .super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
    if (local_b0.super__Vector_base<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.
                      super__Vector_base<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_b0.
                            super__Vector_base<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.
                            super__Vector_base<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  std::
  vector<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
  ::vector(&local_48,&local_78);
  pHVar2 = local_98;
  compress(local_98,&local_48);
  std::
  vector<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
  ::~vector(&local_48);
  std::
  vector<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
  ::~vector(&local_78);
  if (local_60.super__Vector_base<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pHVar2;
}

Assistant:

HashBlock sha256(string message) {
    auto blocks = pad_parse(message.c_str(), message.size());

    auto ws = expand(blocks);
    for (auto w:ws)
    {
        for (auto wi: w)
        {
            cout << wi.to_ulong() << endl;
        }
    }


    return compress(ws);
}